

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O0

void append_states(void)

{
  bool bVar1;
  int iVar2;
  int local_10;
  int symbol;
  int j;
  int i;
  
  for (symbol = 1; symbol < nshifts; symbol = symbol + 1) {
    iVar2 = shift_symbol[symbol];
    local_10 = symbol;
    while( true ) {
      bVar1 = false;
      if (0 < local_10) {
        bVar1 = iVar2 < shift_symbol[local_10 + -1];
      }
      if (!bVar1) break;
      shift_symbol[local_10] = shift_symbol[local_10 + -1];
      local_10 = local_10 + -1;
    }
    shift_symbol[local_10] = iVar2;
  }
  for (symbol = 0; symbol < nshifts; symbol = symbol + 1) {
    iVar2 = get_state(shift_symbol[symbol]);
    shiftset[symbol] = iVar2;
  }
  return;
}

Assistant:

void append_states()
{
    register int i;
    register int j;
    register int symbol;

#ifdef	TRACE
    fprintf(stderr, "Entering append_states()\n");
#endif
    for (i = 1; i < nshifts; i++)
    {
	symbol = shift_symbol[i];
	j = i;
	while (j > 0 && shift_symbol[j - 1] > symbol)
	{
	    shift_symbol[j] = shift_symbol[j - 1];
	    j--;
	}
	shift_symbol[j] = symbol;
    }

    for (i = 0; i < nshifts; i++)
    {
	symbol = shift_symbol[i];
	shiftset[i] = get_state(symbol);
    }
}